

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O0

kMethod * LookupOverloadedMethod(KonohaContext *kctx,kMethod *mtd,kNode *expr,kNameSpace *ns)

{
  code *pcVar1;
  long lVar2;
  KClass *pKVar3;
  KClass *pKVar4;
  kParam *pkVar5;
  KClass *pKVar6;
  kNameSpace *pkVar7;
  kMethod *pkVar8;
  ulong uVar9;
  kmagicflag_t akStack_a0 [3];
  KClass *local_80;
  undefined4 local_74;
  long lStack_70;
  kparamId_t paramdom;
  kNode *texpr;
  KClass *paramType;
  size_t n;
  kParam *pa;
  kparamtype_t *p;
  size_t psize;
  size_t i;
  KClass *thisClass;
  kNameSpace *ns_local;
  kNode *expr_local;
  kMethod *mtd_local;
  KonohaContext *kctx_local;
  
  mtd_local = (kMethod *)kctx;
  expr_local = (kNode *)mtd;
  ns_local = (kNameSpace *)expr;
  thisClass = (KClass *)ns;
  i = *(size_t *)
       ((kctx->share->classTable).field_1.bytebuf +
       (ulong)(*(uint *)((((expr->field_5).NodeList)->field_2).unboxItems[1] + 0x1c) & 0xfffffff) *
       8);
  p = (kparamtype_t *)((((expr->field_5).NodeList)->bytesize >> 3) - 2);
  lVar2 = -((long)p * 8 + 0xfU & 0xfffffffffffffff0);
  pa = (kParam *)(&stack0xffffffffffffff78 + lVar2);
  n = (kctx->share->paramList->field_2).unboxItems[mtd->paramid];
  psize = 0;
  while( true ) {
    pkVar8 = mtd_local;
    pkVar5 = pa;
    if (p <= psize) {
      pcVar1 = *(code **)(mtd_local->invokeKMethodFunc + 0x1f0);
      uVar9 = (ulong)p & 0xffffffff;
      *(undefined8 *)((long)akStack_a0 + lVar2 + 0x10) = 0x128ce9;
      local_74 = (*pcVar1)(pkVar8,uVar9,pkVar5);
      *(kParam **)((long)akStack_a0 + lVar2 + 8) = pa;
      *(undefined8 *)((long)akStack_a0 + lVar2) = 0x128d1b;
      pkVar8 = kNameSpace_GetMethodBySignatureNULL
                         (*(KonohaContext **)((long)&psize + lVar2),
                          *(kNameSpace **)((long)&p + lVar2),*(KClass **)((long)&pa + lVar2),
                          *(ksymbol_t *)((long)&n + lVar2 + 4),*(int *)((long)&n + lVar2),
                          *(int *)((long)&paramType + lVar2 + 4),
                          *(kparamtype_t **)((long)&thisClass + lVar2));
      return pkVar8;
    }
    paramType = (KClass *)(psize + 2);
    if (psize < *(uint *)(n + 0x1c)) {
      *(undefined8 *)((long)akStack_a0 + lVar2 + 0x10) = 0x128c42;
      local_80 = ResolveTypeVariable(*(KonohaContext **)((long)&stack0xffffffffffffff80 + lVar2),
                                     (KClass *)
                                     (((kParam *)(&stack0xffffffffffffff78 + lVar2))->h).magicflag,
                                     *(KClass **)((long)akStack_a0 + lVar2 + 0x10));
    }
    else {
      local_80 = *(KClass **)(*(long *)((mtd_local->field_2).vcode_start + 8) + 8);
    }
    pkVar8 = mtd_local;
    pkVar7 = ns_local;
    pKVar6 = thisClass;
    pKVar4 = paramType;
    pKVar3 = local_80;
    texpr = (kNode *)local_80;
    pcVar1 = *(code **)(mtd_local->invokeKMethodFunc + 0x3c8);
    *(undefined8 *)((long)akStack_a0 + lVar2 + 0x10) = 0x128c8f;
    lStack_70 = (*pcVar1)(pkVar8,pkVar7,pKVar4,pKVar6,pKVar3,1);
    if (*(int *)(lStack_70 + 0x18) == 0x18) break;
    pa->paramtypeItems[psize - 4].typeAttr = *(ktypeattr_t *)(lStack_70 + 0x1c);
    psize = psize + 1;
  }
  return (kMethod *)0x0;
}

Assistant:

static kMethod *LookupOverloadedMethod(KonohaContext *kctx, kMethod *mtd, kNode *expr, kNameSpace *ns)
{
	KClass *thisClass = KClass_(expr->NodeList->NodeItems[1]->typeAttr);
	size_t i, psize = kArray_size(expr->NodeList) - 2;
	kparamtype_t *p = ALLOCA(kparamtype_t, psize);
	kParam *pa = kMethod_GetParam(mtd);
	for(i = 0; i < psize; i++) {
		size_t n = i + 2;
		KClass *paramType = (i < pa->psize) ? ResolveTypeVariable(kctx, KClass_(pa->paramtypeItems[i].typeAttr), thisClass) : KClass_INFER;
		kNode *texpr = KLIB TypeCheckNodeAt(kctx, expr, n, ns, paramType, TypeCheckPolicy_NoCheck);
		if(kNode_IsError(texpr)) return NULL;
		p[i].typeAttr = texpr->typeAttr;
	}
	kparamId_t paramdom = KLIB Kparamdom(kctx, psize, p);
	return kNameSpace_GetMethodBySignatureNULL(kctx, ns, thisClass, mtd->mn, paramdom, psize, p);
}